

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O1

int lh_table_delete_entry(lh_table *t,lh_entry *e)

{
  lh_entry *plVar1;
  lh_entry *plVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = (long)e - (long)t->table;
  if (lVar4 < 0) {
    iVar3 = -2;
  }
  else {
    iVar3 = -1;
    if (*(ulong *)((long)t->table + lVar4) < 0xfffffffffffffffe) {
      t->count = t->count + -1;
      if (t->free_fn != (lh_entry_free_fn *)0x0) {
        (*t->free_fn)(e);
      }
      plVar2 = t->table;
      plVar1 = (lh_entry *)((long)plVar2 + lVar4);
      *(undefined8 *)((long)plVar2 + lVar4 + 0x10) = 0;
      *(undefined8 *)((long)plVar2 + lVar4) = 0xfffffffffffffffe;
      plVar2 = t->tail;
      if ((plVar2 == plVar1) && (t->head == plVar1)) {
        t->head = (lh_entry *)0x0;
        t->tail = (lh_entry *)0x0;
      }
      else if (t->head == plVar1) {
        plVar2 = t->head->next;
        plVar2->prev = (lh_entry *)0x0;
        t->head = plVar2;
      }
      else if (plVar2 == plVar1) {
        plVar2 = plVar2->prev;
        plVar2->next = (lh_entry *)0x0;
        t->tail = plVar2;
      }
      else {
        plVar2 = plVar1->prev;
        plVar2->next = plVar1->next;
        plVar1->next->prev = plVar2;
      }
      plVar1->next = (lh_entry *)0x0;
      plVar1->prev = (lh_entry *)0x0;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int lh_table_delete_entry(struct lh_table *t, struct lh_entry *e)
{
	/* CAW: fixed to be 64bit nice, still need the crazy negative case... */
	ptrdiff_t n = (ptrdiff_t)(e - t->table);

	/* CAW: this is bad, really bad, maybe stack goes other direction on this machine... */
	if (n < 0)
	{
		return -2;
	}

	if (t->table[n].k == LH_EMPTY || t->table[n].k == LH_FREED)
		return -1;
	t->count--;
	if (t->free_fn)
		t->free_fn(e);
	t->table[n].v = NULL;
	t->table[n].k = LH_FREED;
	if (t->tail == &t->table[n] && t->head == &t->table[n])
	{
		t->head = t->tail = NULL;
	}
	else if (t->head == &t->table[n])
	{
		t->head->next->prev = NULL;
		t->head = t->head->next;
	}
	else if (t->tail == &t->table[n])
	{
		t->tail->prev->next = NULL;
		t->tail = t->tail->prev;
	}
	else
	{
		t->table[n].prev->next = t->table[n].next;
		t->table[n].next->prev = t->table[n].prev;
	}
	t->table[n].next = t->table[n].prev = NULL;
	return 0;
}